

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _treeBase.hpp
# Opt level: O1

void __thiscall
ft::
treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
::fixInsertViolation
          (treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
           *this,node *z)

{
  node *x;
  node *pnVar1;
  node *pnVar2;
  treeNode<ft::pair<const_int,_int>_> *ptVar3;
  node *pnVar4;
  
  pnVar4 = (this->m_tree).m_root;
  if ((pnVar4 != z) && (z->colour != BLACK)) {
    while (x = z->parent, x->colour == RED) {
      pnVar4 = x->parent;
      pnVar1 = pnVar4->left;
      pnVar2 = pnVar4->right;
      if (x == pnVar1) {
        if (pnVar2->colour == RED) {
          x->colour = BLACK;
          pnVar2->colour = BLACK;
LAB_0010d3bb:
          pnVar4->colour = RED;
          z = pnVar4;
        }
        else {
          if (z == x->right) {
            rotateLeft(this,x);
            z = x;
          }
          ptVar3 = z->parent;
          ptVar3->colour = BLACK;
          pnVar4 = ptVar3->parent;
          pnVar4->colour = RED;
          rotateRight(this,pnVar4);
        }
      }
      else if (x == pnVar2) {
        if (pnVar1->colour == RED) {
          x->colour = BLACK;
          pnVar1->colour = BLACK;
          goto LAB_0010d3bb;
        }
        if (z == x->left) {
          rotateRight(this,x);
          z = x;
        }
        ptVar3 = z->parent;
        ptVar3->colour = BLACK;
        pnVar4 = ptVar3->parent;
        pnVar4->colour = RED;
        rotateLeft(this,pnVar4);
      }
      pnVar4 = (this->m_tree).m_root;
      if ((z == pnVar4) || (z->colour == BLACK)) break;
    }
  }
  pnVar4->colour = BLACK;
  return;
}

Assistant:

void fixInsertViolation(node* z)
	{
		while (z != this->root() && z->colour != BLACK && z->parent->colour == RED)
		{
			// parent is left child of grandparent
			if (z->parent == z->parent->parent->left)
			{
				node*	y = z->parent->parent->right;
				if (y->colour == RED)
				{
					z->parent->colour = BLACK;
					y->colour = BLACK;
					z->parent->parent->colour = RED;
					z = z->parent->parent;
				}
				else
				{
					// node is right child of parent, rotate left
					if (z == z->parent->right)
					{
						z = z->parent;
						rotateLeft(z);
					}
					// node is left child of parent, swap parent and grandparent colour and rotate right
					z->parent->colour = BLACK;
					z->parent->parent->colour = RED;
					rotateRight(z->parent->parent);
				}
			}
				// parent is right child of grandparent
			else if (z->parent == z->parent->parent->right)
			{
				node*	y = z->parent->parent->left;
				if (y->colour == RED)
				{
					z->parent->colour = BLACK;
					y->colour = BLACK;
					z->parent->parent->colour = RED;
					z = z->parent->parent;
				}
				else
				{
					// node is left child of parent, rotate right
					if (z == z->parent->left)
					{
						z = z->parent;
						rotateRight(z);
					}
					// node is right child of parent, swap parent and grandparent colour and rotate left
					z->parent->colour = BLACK;
					z->parent->parent->colour = RED;
					rotateLeft(z->parent->parent);
				}
			}
		}
		this->root()->colour = BLACK;
	}